

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-try-write-error.c
# Opt level: O0

void incoming_close_cb(uv_handle_t *handle)

{
  FILE *__stream;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  uint local_24;
  undefined8 uStack_20;
  int r;
  uv_buf_t buf;
  uv_handle_t *handle_local;
  
  local_24 = 1;
  close_cb_called = close_cb_called + 1;
  buf.len = (size_t)handle;
  auVar2 = uv_buf_init("meow",4);
  while (__stream = _stderr, buf.base = auVar2._8_8_, uStack_20 = auVar2._0_8_, 0 < (int)local_24) {
    local_24 = uv_try_write(&client,&stack0xffffffffffffffe0,1);
    auVar2._8_8_ = buf.base;
    auVar2._0_8_ = uStack_20;
  }
  uVar1 = uv_strerror(local_24);
  fprintf(__stream,"uv_try_write error: %d %s\n",(ulong)local_24,uVar1);
  if (((local_24 != 0xffffffe0) && (local_24 != 0xffffff99)) && (local_24 != 0xffffff98)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-try-write-error.c"
            ,0x33,"r == UV_EPIPE || r == UV_ECONNABORTED || r == UV_ECONNRESET");
    abort();
  }
  if (client.write_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-try-write-error.c"
            ,0x34,"client.write_queue_size == 0");
    abort();
  }
  return;
}

Assistant:

static void incoming_close_cb(uv_handle_t* handle) {
  uv_buf_t buf;
  int r = 1;

  close_cb_called++;

  buf = uv_buf_init("meow", 4);
  while (r > 0)
    r = uv_try_write((uv_stream_t*) &client, &buf, 1);
  fprintf(stderr, "uv_try_write error: %d %s\n", r, uv_strerror(r));
  ASSERT(r == UV_EPIPE || r == UV_ECONNABORTED || r == UV_ECONNRESET);
  ASSERT(client.write_queue_size == 0);
}